

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh)

{
  TPZGeoMesh *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZVec<long> *unaff_retaddr;
  void **in_stack_00000008;
  TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *in_stack_00000010;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffc0;
  TPZRegisterClassId *pTVar1;
  int matind_00;
  
  pTVar1 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>>(in_RDI,0x21);
  matind_00 = (int)((ulong)pTVar1 >> 0x20);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0243eeb8);
  TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::TPZGeoElRefLess
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,matind_00,in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0243eb90;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0243eb90;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x238));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(nodeindices,matind,mesh) {
}